

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::connectFilterTiming(CommonCore *this)

{
  _Rb_tree_header *p_Var1;
  GlobalFederateId fedID;
  BaseTimeCoordinator *pBVar2;
  int iVar3;
  uint *puVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined4 uVar7;
  undefined4 uVar8;
  ActionMessage add;
  undefined1 local_d0 [16];
  GlobalFederateId GStack_c0;
  InterfaceHandle IStack_bc;
  ushort local_b6;
  
  if (this->filterTiming != false) {
    return;
  }
  this->filterTiming = true;
  fedID.gid = (this->filterFedID)._M_i.gid;
  if ((this->super_BrokerBase).globalTime == true) {
    if ((this->super_BrokerBase).asyncTime != false) goto LAB_003133f0;
    ActionMessage::ActionMessage((ActionMessage *)local_d0,cmd_add_dependent);
    local_b6 = local_b6 | 0x2000;
    GStack_c0.gid = fedID.gid;
    local_d0._8_4_ = 1;
    FilterFederate::handleMessage(this->filterFed,(ActionMessage *)local_d0);
    ActionMessage::setAction((ActionMessage *)local_d0,cmd_add_dependency);
    FilterFederate::handleMessage(this->filterFed,(ActionMessage *)local_d0);
    local_b6 = local_b6 & 0x9fff | 0x4000;
    uVar7 = local_d0._8_4_;
    uVar8 = local_d0._12_4_;
    local_d0._8_8_ = local_d0._16_8_;
    GStack_c0.gid = uVar7;
    IStack_bc.hid = uVar8;
    (*(this->super_Core)._vptr_Core[0x6b])(this,0);
    ActionMessage::setAction((ActionMessage *)local_d0,cmd_add_dependent);
    (*(this->super_Core)._vptr_Core[0x6b])(this,0,local_d0);
  }
  else {
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    iVar3 = (*pBVar2->_vptr_BaseTimeCoordinator[5])
                      (pBVar2,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
    if ((char)iVar3 != '\0') {
      ActionMessage::ActionMessage
                ((ActionMessage *)local_d0,cmd_add_interdependency,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                 (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
      local_b6 = local_b6 | 0x4000;
      p_Var6 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      puVar4 = &parent_route_id;
      if (p_Var6 != (_Base_ptr)0x0) {
        iVar3 = (this->super_BrokerBase).higher_broker_id.gid;
        p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = &p_Var1->_M_header;
        do {
          if (iVar3 <= (int)p_Var6[1]._M_color) {
            p_Var5 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar3];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var5 != p_Var1) {
          puVar4 = &parent_route_id;
          if ((int)p_Var5[1]._M_color <= iVar3) {
            puVar4 = (uint *)&p_Var5[1].field_0x4;
          }
        }
      }
      (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)*puVar4,local_d0);
      pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar2->_vptr_BaseTimeCoordinator[4])
                (pBVar2,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
      BaseTimeCoordinator::setAsParent
                ((this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                 (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
      ActionMessage::~ActionMessage((ActionMessage *)local_d0);
    }
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar2->_vptr_BaseTimeCoordinator[4])(pBVar2,(ulong)(uint)fedID.gid);
    BaseTimeCoordinator::setAsChild
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,fedID);
    ActionMessage::ActionMessage((ActionMessage *)local_d0,cmd_add_dependent);
    local_b6 = local_b6 | 0x2000;
    GStack_c0.gid = fedID.gid;
    local_d0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
    FilterFederate::handleMessage(this->filterFed,(ActionMessage *)local_d0);
    ActionMessage::setAction((ActionMessage *)local_d0,cmd_add_dependency);
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar2->_vptr_BaseTimeCoordinator[5])(pBVar2,(ulong)(uint)fedID.gid);
    BaseTimeCoordinator::setAsChild
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,fedID);
    FilterFederate::handleMessage(this->filterFed,(ActionMessage *)local_d0);
  }
  ActionMessage::~ActionMessage((ActionMessage *)local_d0);
LAB_003133f0:
  this->filterTiming = true;
  return;
}

Assistant:

void CommonCore::connectFilterTiming()
{
    if (filterTiming) {
        return;
    }
    filterTiming = true;

    auto fid = filterFedID.load();
    if (globalTime) {
        if (!asyncTime) {
            ActionMessage add(CMD_ADD_DEPENDENT);
            setActionFlag(add, parent_flag);
            add.dest_id = fid;
            add.source_id = gRootBrokerID;
            filterFed->handleMessage(add);

            add.setAction(CMD_ADD_DEPENDENCY);
            filterFed->handleMessage(add);
            clearActionFlag(add, parent_flag);
            setActionFlag(add, child_flag);
            add.swapSourceDest();
            transmit(parent_route_id, add);
            add.setAction(CMD_ADD_DEPENDENT);
            transmit(parent_route_id, add);
        }
    } else {
        if (timeCoord->addDependent(higher_broker_id)) {
            ActionMessage add(CMD_ADD_INTERDEPENDENCY, global_broker_id_local, higher_broker_id);
            setActionFlag(add, child_flag);
            transmit(getRoute(higher_broker_id), add);
            timeCoord->addDependency(higher_broker_id);
            timeCoord->setAsParent(higher_broker_id);
        }
        // now add the filterFederate as a timeDependency
        timeCoord->addDependency(fid);
        timeCoord->setAsChild(fid);
        ActionMessage add(CMD_ADD_DEPENDENT);
        setActionFlag(add, parent_flag);
        add.dest_id = fid;
        add.source_id = global_broker_id_local;
        filterFed->handleMessage(add);
        // TODO(PT) this should be conditional as it probably isn't needed in all cases
        add.setAction(CMD_ADD_DEPENDENCY);
        timeCoord->addDependent(fid);
        timeCoord->setAsChild(fid);
        filterFed->handleMessage(add);
    }

    //
    filterTiming = true;
}